

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_mark(wchar_t x,wchar_t y)

{
  wchar_t *pwVar1;
  int *piVar2;
  wchar_t *pwVar3;
  wchar_t *old_tcc;
  int *old_taa;
  wchar_t *old_cc;
  int *old_aa;
  wchar_t y_local;
  wchar_t x_local;
  
  pwVar1 = Term->old->c[y];
  piVar2 = Term->old->ta[y];
  pwVar3 = Term->old->tc[y];
  Term->old->a[y][x] = 0x80;
  pwVar1[x] = L'\0';
  piVar2[x] = 0x80;
  pwVar3[x] = L'\0';
  if (y < Term->y1) {
    Term->y1 = y;
  }
  if (Term->y2 < y) {
    Term->y2 = y;
  }
  if (x < Term->x1[y]) {
    Term->x1[y] = x;
  }
  if (Term->x2[y] < x) {
    Term->x2[y] = x;
  }
  return 0;
}

Assistant:

errr Term_mark(int x, int y)
{
	int *old_aa = Term->old->a[y];
	wchar_t *old_cc = Term->old->c[y];
	int *old_taa = Term->old->ta[y];
	wchar_t *old_tcc = Term->old->tc[y];

	/*
	 * using 0x80 as the blank attribute and an impossible value for
	 * the blank char is ok since this function is only called by tile
	 * functions, but ideally there should be a test to use the blank text
	 * attr/char pair
	 */
	old_aa[x] = 0x80; 
	old_cc[x] = 0;
	old_taa[x] = 0x80;
	old_tcc[x] = 0;

	/* Update bounds for modified region. */
	if (y < Term->y1) Term->y1 = y;
	if (y > Term->y2) Term->y2 = y;
	if (x < Term->x1[y]) Term->x1[y] = x;
	if (x > Term->x2[y]) Term->x2[y] = x;

	return (0);
}